

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

void __thiscall ADSBHubConnection::Main(ADSBHubConnection *this)

{
  byte bVar1;
  bool bVar2;
  SOCKET SVar3;
  int iVar4;
  SOCKET SVar5;
  logLevelTy lVar6;
  undefined8 uVar7;
  int *piVar8;
  ssize_t sVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  allocator<char> *__a;
  ulong __n;
  long *in_RDI;
  int iVar13;
  timeval *__timeout;
  SOCKET *s;
  SOCKET *__end1;
  SOCKET *__begin1;
  SOCKET (*__range1) [2];
  runtime_error *e;
  char *p;
  long rcvdBytes;
  int retval;
  timeval timeout;
  fd_set *__arr;
  uint __i;
  fd_set sRead;
  int maxSock;
  ThreadSettings TS;
  FDStaticData *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff928;
  ThreadSettings *in_stack_fffffffffffff930;
  uint8_t *in_stack_fffffffffffff938;
  size_t in_stack_fffffffffffff940;
  ADSBHubConnection *in_stack_fffffffffffff948;
  FDKeyTy *in_stack_fffffffffffff950;
  ADSBHubConnection *in_stack_fffffffffffff958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff960;
  char *local_698;
  char *local_688;
  string *in_stack_fffffffffffff9a8;
  string *w;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  fd_set *pfVar14;
  bool local_592;
  long *local_540;
  char local_501 [37];
  byte local_4dc;
  byte local_4db;
  byte local_4da;
  undefined1 local_4d9 [33];
  string local_4b8 [36];
  byte local_494;
  byte local_493;
  byte local_492;
  allocator<char> local_491;
  string local_490 [32];
  string local_470 [32];
  string local_450 [38];
  undefined1 local_42a;
  undefined1 local_402;
  uint in_stack_fffffffffffffc04;
  size_t in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc14;
  string *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined2 in_stack_fffffffffffffc24;
  undefined1 in_stack_fffffffffffffc26;
  undefined1 in_stack_fffffffffffffc27;
  timeval local_348;
  fd_set *local_330;
  uint local_324;
  fd_set local_320;
  int local_2a0;
  undefined1 local_29a;
  int local_278;
  allocator<char> local_271;
  string local_270 [32];
  positionTy local_250;
  long local_208;
  long lStack_200;
  long local_1f8;
  long lStack_1f0;
  long local_1e8;
  long lStack_1e0;
  long local_1d8;
  long lStack_1d0;
  long local_1c8;
  
  ThreadSettings::ThreadSettings
            (in_stack_fffffffffffff930,(char *)in_stack_fffffffffffff928,in_stack_fffffffffffff924,
             (char *)in_stack_fffffffffffff918);
  *(undefined4 *)(in_RDI + 0x4e) = 0;
  std::__cxx11::string::clear();
  LTFlightData::FDKeyTy::clear(in_stack_fffffffffffff950);
  LTFlightData::FDStaticData::FDStaticData
            ((FDStaticData *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  LTFlightData::FDStaticData::operator=
            ((FDStaticData *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             in_stack_fffffffffffff918);
  LTFlightData::FDStaticData::~FDStaticData
            ((FDStaticData *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  LTFlightData::FDDynamicData::FDDynamicData
            ((FDDynamicData *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  in_RDI[0x95] = local_1c8;
  in_RDI[0x93] = local_1d8;
  in_RDI[0x94] = lStack_1d0;
  in_RDI[0x91] = local_1e8;
  in_RDI[0x92] = lStack_1e0;
  in_RDI[0x8f] = local_1f8;
  in_RDI[0x90] = lStack_1f0;
  in_RDI[0x8d] = local_208;
  in_RDI[0x8e] = lStack_200;
  positionTy::positionTy(&local_250);
  in_RDI[0x9e] = local_250.edgeIdx;
  in_RDI[0x9c] = (long)local_250._roll;
  in_RDI[0x9d] = local_250._56_8_;
  in_RDI[0x9a] = (long)local_250._head;
  in_RDI[0x9b] = (long)local_250._pitch;
  in_RDI[0x98] = (long)local_250._alt;
  in_RDI[0x99] = (long)local_250._ts;
  in_RDI[0x96] = (long)local_250._lat;
  in_RDI[0x97] = (long)local_250._lon;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
             (allocator<char> *)in_stack_fffffffffffff950);
  XPMP2::SocketNetworking::Connect
            ((SocketNetworking *)
             CONCAT17(in_stack_fffffffffffffc27,
                      CONCAT16(in_stack_fffffffffffffc26,
                               CONCAT24(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20))),
             in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,in_stack_fffffffffffffc08,
             in_stack_fffffffffffffc04);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator(&local_271);
  SVar3 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
  local_278 = SVar3 + 1;
  iVar4 = pipe((int *)(in_RDI + 0x49));
  if (iVar4 < 0) {
    local_29a = 1;
    uVar7 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
               (allocator<char> *)in_stack_fffffffffffff950);
    XPMP2::NetRuntimeError::NetRuntimeError
              ((NetRuntimeError *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
               in_stack_fffffffffffff9a8);
    local_29a = 0;
    __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl((int)in_RDI[0x49],4,0x800);
  local_2a0 = (int)in_RDI[0x49] + 1;
  piVar8 = std::max<int>(&local_278,&local_2a0);
  local_278 = *piVar8;
  while( true ) {
    bVar1 = (**(code **)(*in_RDI + 0x20))();
    local_592 = false;
    if ((bVar1 & 1) != 0) {
      local_592 = XPMP2::SocketNetworking::isOpen((SocketNetworking *)(in_RDI + 0x3d));
    }
    if (local_592 == false) break;
    local_330 = &local_320;
    for (local_324 = 0; local_324 < 0x10; local_324 = local_324 + 1) {
      local_330->fds_bits[local_324] = 0;
    }
    SVar5 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
    SVar3 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
    if (SVar3 < 0) {
      SVar3 = SVar3 + 0x3f;
    }
    local_320.fds_bits[SVar3 >> 6] = local_320.fds_bits[SVar3 >> 6] | 1L << ((byte)SVar5 & 0x3f);
    iVar4 = (int)in_RDI[0x49];
    iVar13 = iVar4;
    if (iVar4 < 0) {
      iVar13 = iVar4 + 0x3f;
    }
    local_320.fds_bits[iVar13 >> 6] =
         local_320.fds_bits[iVar13 >> 6] | 1L << ((ulong)(byte)iVar4 & 0x3f);
    local_348.tv_sec = 0x3c;
    local_348.tv_usec = 0;
    __timeout = &local_348;
    iVar4 = select(local_278,&local_320,(fd_set *)0x0,(fd_set *)0x0,__timeout);
    iVar13 = (int)__timeout;
    bVar1 = (**(code **)(*in_RDI + 0x20))();
    if ((bVar1 & 1) == 0) break;
    if (iVar4 == -1) {
      uVar7 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                 (allocator<char> *)in_stack_fffffffffffff950);
      XPMP2::NetRuntimeError::NetRuntimeError
                ((NetRuntimeError *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                 in_stack_fffffffffffff9a8);
      __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
    }
    if (iVar4 == 0) {
      uVar7 = __cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                 (allocator<char> *)in_stack_fffffffffffff950);
      XPMP2::NetRuntimeError::NetRuntimeError
                ((NetRuntimeError *)CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                 in_stack_fffffffffffff9a8);
      __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
    }
    if (0 < iVar4) {
      pfVar14 = &local_320;
      SVar3 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
      if (SVar3 < 0) {
        SVar3 = SVar3 + 0x3f;
      }
      uVar12 = pfVar14->fds_bits[SVar3 >> 6];
      SVar3 = XPMP2::SocketNetworking::getSocket((SocketNetworking *)(in_RDI + 0x3d));
      __n = 1L << ((byte)((long)SVar3 % 0x40) & 0x3f);
      if ((uVar12 & __n) != 0) {
        sVar9 = XPMP2::SocketNetworking::recv
                          ((SocketNetworking *)(in_RDI + 0x3d),0,(void *)0x0,__n,iVar13);
        if (sVar9 < 1) {
          GetPublicIPv4_abi_cxx11_();
          std::__cxx11::string::operator=((string *)(in_RDI + 0x4a),local_450);
          std::__cxx11::string::~string(local_450);
          *(undefined4 *)(in_RDI + 0x4e) = 3;
          lVar6 = DataRefs::GetLogLevel(&dataRefs);
          if ((int)lVar6 < 4) {
            uVar12 = std::__cxx11::string::empty();
            local_492 = 0;
            local_493 = 0;
            local_494 = 0;
            if ((uVar12 & 1) == 0) {
              std::allocator<char>::allocator();
              local_492 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                         (allocator<char> *)in_stack_fffffffffffff950);
              local_493 = 1;
              std::operator+(in_stack_fffffffffffff928,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
              local_494 = 1;
              local_688 = (char *)std::__cxx11::string::c_str();
            }
            else {
              local_688 = "";
            }
            LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
                   ,0xcc,"Main",logERR,
                   "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s"
                   ,local_688);
            if ((local_494 & 1) != 0) {
              std::__cxx11::string::~string(local_470);
            }
            if ((local_493 & 1) != 0) {
              std::__cxx11::string::~string(local_490);
            }
            if ((local_492 & 1) != 0) {
              std::allocator<char>::~allocator(&local_491);
            }
          }
          uVar12 = std::__cxx11::string::empty();
          local_4da = 0;
          local_4db = 0;
          local_4dc = 0;
          if ((uVar12 & 1) == 0) {
            in_stack_fffffffffffff960 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d9;
            std::allocator<char>::allocator();
            local_4da = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                       (allocator<char> *)in_stack_fffffffffffff950);
            local_4db = 1;
            std::operator+(in_stack_fffffffffffff928,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
            local_4dc = 1;
            local_698 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_698 = "";
          }
          CreateMsgWindow(12.0,logERR,
                          "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s"
                          ,local_698);
          if ((local_4dc & 1) != 0) {
            std::__cxx11::string::~string(local_4b8);
          }
          if ((local_4db & 1) != 0) {
            std::__cxx11::string::~string((string *)(local_4d9 + 1));
          }
          if ((local_4da & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)local_4d9);
          }
          __a = (allocator<char> *)__cxa_allocate_exception(0x50);
          pcVar10 = local_501;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffff960,pcVar10,__a);
          XPMP2::NetRuntimeError::NetRuntimeError
                    ((NetRuntimeError *)
                     CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                     in_stack_fffffffffffff9a8);
          __cxa_throw(__a,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError
                     );
        }
        if (((int)in_RDI[0x4e] == 0) && (2 < sVar9)) {
          pcVar10 = XPMP2::SocketNetworking::getBuf((SocketNetworking *)(in_RDI + 0x3d));
          iVar4 = isalpha((int)*pcVar10);
          if (((iVar4 == 0) || (iVar4 = isalpha((int)pcVar10[1]), iVar4 == 0)) ||
             ((iVar4 = isalpha((int)pcVar10[2]), iVar4 == 0 && (pcVar10[2] != ',')))) {
            *(undefined4 *)(in_RDI + 0x4e) = 2;
          }
          else {
            *(undefined4 *)(in_RDI + 0x4e) = 1;
          }
        }
        lVar11 = std::chrono::_V2::steady_clock::now();
        in_RDI[0x4f] = lVar11;
        switch((int)in_RDI[0x4e]) {
        case 0:
        case 3:
          local_42a = 1;
          uVar7 = __cxa_allocate_exception(0x50);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                     (allocator<char> *)in_stack_fffffffffffff950);
          XPMP2::NetRuntimeError::NetRuntimeError
                    ((NetRuntimeError *)
                     CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                     in_stack_fffffffffffff9a8);
          local_42a = 0;
          __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,
                      XPMP2::NetRuntimeError::~NetRuntimeError);
        case 1:
          XPMP2::SocketNetworking::getBuf((SocketNetworking *)(in_RDI + 0x3d));
          bVar2 = StreamProcessDataSBS
                            (in_stack_fffffffffffff958,(size_t)in_stack_fffffffffffff950,
                             (char *)in_stack_fffffffffffff948);
          if (!bVar2) {
            uVar7 = __cxa_allocate_exception(0x50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                       (allocator<char> *)in_stack_fffffffffffff950);
            XPMP2::NetRuntimeError::NetRuntimeError
                      ((NetRuntimeError *)
                       CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                       in_stack_fffffffffffff9a8);
            __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
          break;
        case 2:
          XPMP2::SocketNetworking::getBuf((SocketNetworking *)(in_RDI + 0x3d));
          in_stack_fffffffffffff9b7 =
               StreamProcessDataVRS
                         (in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                          in_stack_fffffffffffff938);
          if (!(bool)in_stack_fffffffffffff9b7) {
            local_402 = 1;
            uVar7 = __cxa_allocate_exception(0x50);
            w = (string *)&stack0xfffffffffffffbff;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff960,(char *)in_stack_fffffffffffff958,
                       (allocator<char> *)in_stack_fffffffffffff950);
            XPMP2::NetRuntimeError::NetRuntimeError
                      ((NetRuntimeError *)
                       CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),w);
            local_402 = 0;
            __cxa_throw(uVar7,&XPMP2::NetRuntimeError::typeinfo,
                        XPMP2::NetRuntimeError::~NetRuntimeError);
          }
        }
      }
    }
  }
  for (local_540 = in_RDI + 0x49; local_540 != in_RDI + 0x4a;
      local_540 = (long *)((long)local_540 + 4)) {
    if ((int)*local_540 != -1) {
      close((int)*local_540);
    }
    *(int *)local_540 = -1;
  }
  XPMP2::TCPConnection::Close
            ((TCPConnection *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920));
  return;
}

Assistant:

void ADSBHubConnection::Main ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ADSBHub", LC_ALL_MASK);

    try {
        // Clear some data so we can also cleanly restart
        eFormat = FMT_UNKNOWN;
        lnLeftOver.clear();
        fdKey.clear();
        stat = LTFlightData::FDStaticData();
        dyn = LTFlightData::FDDynamicData();
        pos = positionTy();

        // open a TCP connection to APRS.glidernet.org
        tcpStream.Connect(ADSBHUB_HOST, ADSBHUB_PORT, ADSBHUB_BUF_SIZE, unsigned(ADSBHUB_TIMEOUT_S * 1000));
        int maxSock = (int)tcpStream.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(streamPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(streamPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, streamPipe[0]+1);
#endif
        
        // *** Main Loop ***
        while (shallRun() && tcpStream.isOpen())
        {
            // wait for some signal on either socket (Stream or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpStream.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(streamPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { ADSBHUB_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpStream.getSocket(), &sRead))
            {
                // read Stream data
                long rcvdBytes = tcpStream.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // if not yet decided: decided on received message format (very first frame only)
                    if (!eFormat && rcvdBytes >= 3) {
                        const char* p = tcpStream.getBuf();
                        if (std::isalpha(p[0]) && std::isalpha(p[1]) &&
                            (std::isalpha(p[2]) || p[2] == ','))
                            eFormat = FMT_SBS;
                        else
                            eFormat = FMT_ComprVRS;
                    }
                    
                    // have it processed
                    lastData = std::chrono::steady_clock::now();
                    switch (eFormat) {
                        case FMT_SBS:
                            if (!StreamProcessDataSBS(size_t(rcvdBytes), tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataSBS failed");
                            break;
                        case FMT_ComprVRS:
                            if (!StreamProcessDataVRS(size_t(rcvdBytes), (const uint8_t*)tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataVRS failed");
                            break;
                        case FMT_NULL_DATA:
                        case FMT_UNKNOWN:
                            throw XPMP2::NetRuntimeError("Format yet unknown, received too few data");
                    }
                }
                else {
                    sPublicIPv4addr = GetPublicIPv4();
                    eFormat = FMT_NULL_DATA;
                    SHOW_MSG(logERR, "Received no data from ADSBHub. Verify 'Read Access' configuration at ADSBHub!%s",
                             sPublicIPv4addr.empty() ? "" : (std::string("\nYour public IP address appears to be ") + sPublicIPv4addr).c_str());
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket (IP address correctly set up in ADSBHub settings?)");
                }
            }
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                ADSBHUB_HOST, std::to_string(ADSBHUB_PORT).c_str(),
                e.what());
        // Set channel to invalid
        SetValid(false,true);
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: streamPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpStream.Close();
}